

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShallowSerializer.hpp
# Opt level: O0

void supermap::io::ShallowSerializer<char>::serialize(char *value,ostream *os)

{
  streamoff sVar1;
  IOException *this;
  char *in_RSI;
  long in_RDI;
  undefined1 auVar2 [16];
  pos_type posBefore;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  fpos<__mbstate_t> local_110 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  long in_stack_ffffffffffffff18;
  string local_50 [32];
  fpos<__mbstate_t> local_30 [16];
  fpos<__mbstate_t> local_20 [16];
  char *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = (fpos<__mbstate_t>  [16])std::ostream::tellp();
  std::ostream::write(local_10,local_8);
  local_30 = (fpos<__mbstate_t>  [16])std::ostream::tellp();
  sVar1 = std::fpos<__mbstate_t>::operator-(local_30,local_20);
  if (sVar1 != 1) {
    this = (IOException *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff08);
    std::operator+((char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::operator+(in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
    auVar2 = std::ostream::tellp();
    local_110 = (fpos<__mbstate_t>  [16])auVar2;
    std::fpos<__mbstate_t>::operator-(local_110,local_20);
    std::__cxx11::to_string(in_stack_ffffffffffffff18);
    std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::operator+(auVar2._0_8_,auVar2._8_8_);
    supermap::IOException::IOException(this,local_50);
    __cxa_throw(this,&IOException::typeinfo,IOException::~IOException);
  }
  return;
}

Assistant:

static void serialize(const T &value, std::ostream &os) {
        auto posBefore = os.tellp();
        os.write(reinterpret_cast<const char *>(&value), sizeof(T));
        if (os.tellp() - posBefore != sizeof(T)) {
            throw IOException(
                "Attempted to write " + std::to_string(sizeof(T)) +
                    " bytes, but only " + std::to_string(os.tellp() - posBefore) +
                    " succeeded"
            );
        }
    }